

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-cat.c
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  FILE *pFVar2;
  size_t __ptr;
  int iVar3;
  BigFile BVar4;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  BigFile *pBVar8;
  BigFile start_00;
  long lVar9;
  int j;
  char local_548 [8];
  char str [300];
  undefined1 local_410 [8];
  BigArrayIter iter;
  BigArray array;
  BigBlock bb;
  BigFile local_60;
  size_t buffersize;
  BigFile local_50;
  BigFile bf;
  ptrdiff_t start;
  BigFile local_38;
  ptrdiff_t size;
  
  local_50.basename = (char *)0x0;
  bf.basename = (char *)0x0;
  local_38.basename = (char *)0xffffffffffffffff;
  array.data = (void *)0x0;
  local_60.basename = (char *)0x10000000;
  bVar1 = true;
  buffersize = 0;
LAB_0010245f:
  do {
    while( true ) {
      iVar3 = getopt(argc,argv,"bo:c:B:f:");
      if (iVar3 != 0x42) break;
      pBVar8 = &local_60;
LAB_0010249e:
      __isoc99_sscanf(_optarg,"%td",pBVar8);
    }
    if (iVar3 == 99) {
      pBVar8 = &local_38;
      goto LAB_0010249e;
    }
    if (iVar3 == 0x6f) {
      pBVar8 = &bf;
      goto LAB_0010249e;
    }
    if (iVar3 == -1) {
      lVar9 = (long)_optind;
      if (argc - _optind == 2) {
        iVar3 = big_file_open(&local_50,argv[lVar9]);
        if (iVar3 == 0) {
          iVar3 = big_file_open_block(&local_50,(BigBlock *)&array.data,argv[lVar9 + 1]);
          if (iVar3 != 0) {
            pcVar6 = argv[lVar9 + 1];
            goto LAB_00102736;
          }
          if (bf.basename + local_38.basename != (char *)0x0 ||
              local_38.basename == (char *)0xffffffffffffffff) {
            local_38.basename = -bf.basename;
          }
          count = (size_t)local_38.basename;
          signal(10,usr1);
          BVar4.basename = local_60.basename;
          pcVar6 = local_38.basename + bf.basename;
          big_file_dtype_itemsize((char *)&array.data);
          BVar4.basename = (char *)(BVar4.basename / 0);
          start_00 = bf;
          while( true ) {
            if ((long)pcVar6 <= (long)start_00.basename) {
              big_block_close((BigBlock *)&array.data);
              big_file_close(&local_50);
              return 0;
            }
            if (local_38.basename <= BVar4.basename) {
              BVar4.basename = local_38.basename;
            }
            iVar3 = big_block_read_simple
                              ((BigBlock *)&array.data,(ptrdiff_t)start_00.basename,
                               (ptrdiff_t)BVar4.basename,(BigArray *)&iter.dataptr,(char *)0x0);
            __ptr = array.size;
            if (iVar3 != 0) break;
            if (bVar1) {
              big_array_iter_init((BigArrayIter *)local_410,(BigArray *)&iter.dataptr);
              for (uVar5 = 0; uVar5 < (ulong)array._8_8_; uVar5 = uVar5 + 1) {
                for (iVar3 = 0; iVar3 < 0; iVar3 = iVar3 + 1) {
                  big_file_dtype_format
                            (local_548,(char *)((long)&iter.dataptr + 4),(void *)iter._264_8_,
                             (char *)buffersize);
                  big_array_iter_advance((BigArrayIter *)local_410);
                  fprintf(_stdout,"%s ",local_548);
                }
                fputc(10,_stdout);
              }
            }
            else {
              iVar3 = big_file_dtype_itemsize((char *)&array.data);
              fwrite((void *)__ptr,(long)iVar3,array.strides[0x1f],_stdout);
            }
            free((void *)array.size);
            start_00.basename = start_00.basename + array._8_8_;
            countin = countin + array._8_8_;
          }
          goto LAB_001026ec;
        }
        pcVar6 = argv[lVar9];
LAB_00102736:
        pFVar2 = _stderr;
        pcVar7 = big_file_get_error_message();
        fprintf(pFVar2,"failed to open: %s: %s\n",pcVar6,pcVar7);
        goto LAB_0010270f;
      }
LAB_001026e7:
      usage();
LAB_001026ec:
      pFVar2 = _stderr;
      pcVar6 = big_file_get_error_message();
      fprintf(pFVar2,"failed to read original: %s\n",pcVar6);
LAB_0010270f:
      exit(1);
    }
    if (iVar3 == 0x62) break;
    if (iVar3 != 0x66) goto LAB_001026e7;
    buffersize = _optarg;
  } while( true );
  bVar1 = false;
  goto LAB_0010245f;
}

Assistant:

int main(int argc, char * argv[]) {
    BigFile bf = {0};
    BigBlock bb = {0};
    int opt;

    int humane = 1; /* binary or ascii */
    ptrdiff_t start = 0;
    ptrdiff_t size = -1;

    size_t buffersize = 256 * 1024 * 1024;

    char * fmt = NULL;

    while(-1 != (opt = getopt(argc, argv, "bo:c:B:f:"))) {
        switch(opt) {
            case 'f':
                fmt = optarg;
                break;
            case 'b':
                humane = 0;
                break;
            case 'o':
                sscanf(optarg, "%td", &start);
                break;
            case 'c':
                sscanf(optarg, "%td", &size);
                break;
            case 'B':
                sscanf(optarg, "%td", &buffersize);
                break;
            default:
                usage();
        }
    }
    if(argc - optind != 2) {
        usage();
    }
    argv += optind - 1;
    if(0 != big_file_open(&bf, argv[1])) {
        fprintf(stderr, "failed to open: %s: %s\n", argv[1], big_file_get_error_message());
        exit(1);
    }
    if(0 != big_file_open_block(&bf, &bb, argv[2])) {
        fprintf(stderr, "failed to open: %s: %s\n", argv[2], big_file_get_error_message());
        exit(1);
    }
    if(size == -1 || bb.size < size + start) {
        size = bb.size - start;
    } 

    count = size;

    signal(SIGUSR1, usr1);

    ptrdiff_t end = start + size;

    size_t chunksize = buffersize / (bb.nmemb * big_file_dtype_itemsize(bb.dtype));
    BigBlockPtr ptr;
    BigBlockPtr ptrnew;
    ptrdiff_t offset;
    BigArray array;

    for(offset = start; offset < end; ) {
        if(chunksize > size) chunksize = size;
        if(0 != big_block_read_simple(&bb, offset, chunksize, &array, NULL)) {
            fprintf(stderr, "failed to read original: %s\n", big_file_get_error_message());
            exit(1);
        }

        if(!humane) {
            fwrite(array.data, big_file_dtype_itemsize(bb.dtype), array.size, stdout);
        } else {
            char str[300];
            BigArrayIter iter;
            big_array_iter_init(&iter, &array);
            size_t i;
            for(i = 0; i < array.dims[0]; i++) {
                int j;
                for(j = 0; j < bb.nmemb; j ++) {
                    big_file_dtype_format(str, array.dtype, iter.dataptr, fmt);
                    big_array_iter_advance(&iter);
                    fprintf(stdout, "%s ", str);
                }
                fprintf(stdout, "\n");
            }
        }
        free(array.data);
        offset += array.dims[0];
        countin += array.dims[0];
    }
    big_block_close(&bb);
    big_file_close(&bf);
    return 0;
}